

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O2

StringRef __thiscall
llvm::sys::detail::getHostCPUNameForS390x(detail *this,StringRef ProcCpuinfoContent)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  type tVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  StringRef *this_00;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  StringRef Separator;
  StringRef Str;
  StringRef Str_00;
  StringRef SVar12;
  size_t sStack_480;
  uint Id;
  StringRef local_470;
  StringRef ProcCpuinfoContent_local;
  SmallVector<llvm::StringRef,_32U> Lines;
  SmallVector<llvm::StringRef,_32U> CPUFeatures;
  
  ProcCpuinfoContent_local.Length = (size_t)ProcCpuinfoContent.Data;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &Lines.super_SmallVectorStorage<llvm::StringRef,_32U>;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Separator.Length = 1;
  Separator.Data = "\n";
  ProcCpuinfoContent_local.Data = (char *)this;
  StringRef::split(&ProcCpuinfoContent_local,&Lines.super_SmallVectorImpl<llvm::StringRef>,Separator
                   ,-1,true);
  CPUFeatures.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &CPUFeatures.super_SmallVectorStorage<llvm::StringRef,_32U>;
  CPUFeatures.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  CPUFeatures.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  uVar7 = Lines.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  lVar9 = 8;
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    if ((Lines.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) <= uVar8) goto LAB_0013d4b1;
    if ((7 < *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar9)) &&
       (this_00 = (StringRef *)
                  ((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                         super_SmallVectorBase.BeginX + lVar9 + -8),
       *(long *)this_00->Data == 0x7365727574616566)) {
      Str.Length = 1;
      Str.Data = ":";
      sVar6 = StringRef::find(this_00,Str,0);
      if (sVar6 != 0xffffffffffffffff) {
        if (Lines.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
            (uint)uVar8) goto LAB_0013d4b1;
        if (*(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + lVar9) <= sVar6) goto LAB_0013d4d0;
        local_470.Length =
             *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar9) - (sVar6 + 1);
        local_470.Data =
             (char *)(sVar6 + 1 +
                     *(long *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                     super_SmallVectorBase.BeginX + lVar9 + -8));
        StringRef::split(&local_470,&CPUFeatures.super_SmallVectorImpl<llvm::StringRef>,' ',-1,true)
        ;
        break;
      }
    }
    lVar9 = lVar9 + 0x10;
  }
  pvVar3 = CPUFeatures.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  uVar8 = CPUFeatures.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  bVar1 = false;
  for (lVar9 = 0;
      pvVar2 = Lines.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX,
      uVar8 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
    if (*(long *)((long)pvVar3 + lVar9 + 8) == 2) {
      iVar5 = bcmp(*(void **)((long)pvVar3 + lVar9),"vx",2);
      if (iVar5 == 0) {
        bVar1 = true;
      }
    }
  }
  uVar8 = Lines.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff;
  uVar10 = 0;
  lVar9 = 0;
  do {
    if (uVar8 << 4 == lVar9) {
LAB_0013d415:
      sStack_480 = 7;
      pcVar11 = "generic";
LAB_0013d41f:
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                (&CPUFeatures.super_SmallVectorImpl<llvm::StringRef>);
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                (&Lines.super_SmallVectorImpl<llvm::StringRef>);
      SVar12.Length = sStack_480;
      SVar12.Data = pcVar11;
      return SVar12;
    }
    if (9 < *(ulong *)((long)pvVar2 + lVar9 + 8)) {
      iVar5 = bcmp(*(void **)((long)pvVar2 + lVar9),"processor ",10);
      if (iVar5 == 0) {
        Str_00.Length = 10;
        Str_00.Data = "machine = ";
        sVar6 = StringRef::find((StringRef *)((long)pvVar2 + lVar9),Str_00,0);
        if (sVar6 == 0xffffffffffffffff) goto LAB_0013d415;
        if (Lines.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
            uVar10) {
LAB_0013d4b1:
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        uVar7 = sVar6 + 10;
        uVar8 = *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + lVar9 + 8);
        if (uVar8 < uVar7) {
LAB_0013d4d0:
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        local_470.Data =
             (char *)(uVar7 + *(long *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>
                                              .super_SmallVectorBase.BeginX + lVar9));
        local_470.Length = uVar8 - uVar7;
        tVar4 = StringRef::getAsInteger<unsigned_int>(&local_470,10,&Id);
        if (tVar4) goto LAB_0013d415;
        if (Id < 0xf42) {
          if (Id < 0xb94) {
            if (Id < 0xb0b) {
              if (0xb00 < Id) {
                sStack_480 = 4;
                pcVar11 = "z196";
                goto LAB_0013d41f;
              }
              goto LAB_0013d415;
            }
          }
          else if (bVar1) {
            sStack_480 = 3;
            pcVar11 = "z13";
            goto LAB_0013d41f;
          }
        }
        else if (bVar1) {
          sStack_480 = 3;
          pcVar11 = "z14";
          goto LAB_0013d41f;
        }
        sStack_480 = 5;
        pcVar11 = "zEC12";
        goto LAB_0013d41f;
      }
    }
    lVar9 = lVar9 + 0x10;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

StringRef sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent) {
  // STIDP is a privileged operation, so use /proc/cpuinfo instead.

  // The "processor 0:" line comes after a fair amount of other information,
  // including a cache breakdown, but this should be plenty.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU features.
  SmallVector<StringRef, 32> CPUFeatures;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I)
    if (Lines[I].startswith("features")) {
      size_t Pos = Lines[I].find(":");
      if (Pos != StringRef::npos) {
        Lines[I].drop_front(Pos + 1).split(CPUFeatures, ' ');
        break;
      }
    }

  // We need to check for the presence of vector support independently of
  // the machine type, since we may only use the vector register set when
  // supported by the kernel (and hypervisor).
  bool HaveVectorSupport = false;
  for (unsigned I = 0, E = CPUFeatures.size(); I != E; ++I) {
    if (CPUFeatures[I] == "vx")
      HaveVectorSupport = true;
  }

  // Now check the processor machine type.
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("processor ")) {
      size_t Pos = Lines[I].find("machine = ");
      if (Pos != StringRef::npos) {
        Pos += sizeof("machine = ") - 1;
        unsigned int Id;
        if (!Lines[I].drop_front(Pos).getAsInteger(10, Id)) {
          if (Id >= 3906 && HaveVectorSupport)
            return "z14";
          if (Id >= 2964 && HaveVectorSupport)
            return "z13";
          if (Id >= 2827)
            return "zEC12";
          if (Id >= 2817)
            return "z196";
        }
      }
      break;
    }
  }

  return "generic";
}